

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::readTiles
          (Data *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly,bool countsOnly)

{
  int iVar1;
  exr_context_t p_Var2;
  ostream *poVar3;
  InputExc *pIVar4;
  Task *pTVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  stringstream _iex_throw_s_1;
  exr_result_t rv_1;
  int tx_1;
  int ty_1;
  TileProcess tp;
  stringstream _iex_throw_s;
  exr_result_t rv;
  int tx;
  int ty;
  TaskGroup tg;
  TileProcessGroup tpg;
  exr_chunk_info_t cinfo;
  int nTiles;
  TileProcess *in_stack_fffffffffffff900;
  ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff920;
  exr_chunk_info_t *in_stack_fffffffffffff928;
  DeepFrameBuffer *in_stack_fffffffffffff930;
  TileProcessGroup *in_stack_fffffffffffff938;
  Data *in_stack_fffffffffffff940;
  TaskGroup *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  stringstream local_640 [16];
  ostream local_630 [304];
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *in_stack_fffffffffffffb00;
  DeepFrameBuffer *in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb14;
  exr_const_context_t in_stack_fffffffffffffb18;
  TileProcess *in_stack_fffffffffffffb20;
  int local_4b0;
  int local_4ac;
  TileProcess local_4a8;
  stringstream local_260 [16];
  ostream local_250 [376];
  int local_d8;
  int local_d4;
  int local_d0;
  TaskGroup local_c0 [88];
  exr_chunk_info_t local_68;
  int local_24;
  byte local_1d;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_1d = in_stack_00000010 & 1;
  local_24 = ((in_R8D - in_ECX) + 1) * ((in_EDX - in_ESI) + 1);
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((local_24 < 2) || (*(int *)(in_RDI + 0xc) < 2)) {
    anon_unknown_14::TileProcess::TileProcess(&local_4a8);
    local_4a8.counts_only = (bool)(local_1d & 1);
    for (local_4ac = local_14; local_4ac <= local_18; local_4ac = local_4ac + 1) {
      for (local_4b0 = local_c; local_4b0 <= local_10; local_4b0 = local_4b0 + 1) {
        p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b879b);
        iVar1 = exr_read_tile_chunk_info
                          (p_Var2,*(undefined4 *)(in_RDI + 8),local_4b0,local_4ac,local_1c,
                           in_stack_00000008,&local_68);
        if (iVar1 == 0x18) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_640);
          poVar3 = std::operator<<(local_630,"Tile (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4b0);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4ac);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_stack_00000008);
          std::operator<<(poVar3,") is missing.");
          pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar4,local_640);
          __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        if (iVar1 != 0) {
          pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar4,"Unable to query tile information");
          __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        local_4a8.cinfo.sample_count_data_offset = local_68.sample_count_data_offset;
        local_4a8.cinfo.sample_count_table_size = local_68.sample_count_table_size;
        local_4a8.cinfo.packed_size = local_68.packed_size;
        local_4a8.cinfo.unpacked_size = local_68.unpacked_size;
        local_4a8.cinfo.width = local_68.width;
        local_4a8.cinfo.level_x = local_68.level_x;
        local_4a8.cinfo.level_y = local_68.level_y;
        local_4a8.cinfo.type = local_68.type;
        local_4a8.cinfo.compression = local_68.compression;
        local_4a8.cinfo.data_offset = local_68.data_offset;
        local_4a8.cinfo.idx = local_68.idx;
        local_4a8.cinfo.start_x = local_68.start_x;
        local_4a8.cinfo.start_y = local_68.start_y;
        local_4a8.cinfo.height = local_68.height;
        Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b8a4b);
        anon_unknown_14::TileProcess::run_decode
                  (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
                   in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      }
    }
    anon_unknown_14::TileProcess::~TileProcess(in_stack_fffffffffffff900);
  }
  else {
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::ProcessGroup
              ((ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *)
               in_stack_fffffffffffff930,(uint)((ulong)in_stack_fffffffffffff928 >> 0x20));
    IlmThread_3_4::TaskGroup::TaskGroup(local_c0);
    for (local_d0 = local_14; local_d0 <= local_18; local_d0 = local_d0 + 1) {
      for (local_d4 = local_c; local_d4 <= local_10; local_d4 = local_d4 + 1) {
        p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b837f);
        local_d8 = exr_read_tile_chunk_info
                             (p_Var2,*(undefined4 *)(in_RDI + 8),local_d4,local_d0,local_1c,
                              in_stack_00000008,&local_68);
        if (local_d8 == 0x18) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_260);
          poVar3 = std::operator<<(local_250,"Tile (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d4);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_stack_00000008);
          std::operator<<(poVar3,") is missing.");
          pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar4,local_260);
          __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        if (local_d8 != 0) {
          pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar4,"Unable to query tile information");
          __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        pTVar5 = (Task *)operator_new(0x30);
        TileBufferTask::TileBufferTask
                  ((TileBufferTask *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948,in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                   in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                   SUB81((ulong)in_stack_fffffffffffff920 >> 0x38,0));
        IlmThread_3_4::ThreadPool::addGlobalTask(pTVar5);
      }
    }
    IlmThread_3_4::TaskGroup::~TaskGroup(local_c0);
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::throw_on_failure
              ((ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *)
               in_stack_fffffffffffff940);
    IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::~ProcessGroup
              (in_stack_fffffffffffff910);
  }
  return;
}

Assistant:

void DeepTiledInputFile::Data::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly, bool countsOnly)
{
    int nTiles = dx2 - dx1 + 1;
    nTiles *= dy2 - dy1 + 1;

    exr_chunk_info_t      cinfo;
#if ILMTHREAD_THREADING_ENABLED
    if (nTiles > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        TileProcessGroup tpg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int ty = dy1; ty <= dy2; ++ty)
            {
                for (int tx = dx1; tx <= dx2; ++tx)
                {
                    exr_result_t rv = exr_read_tile_chunk_info (
                        *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                    if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                    {
                        THROW (
                            IEX_NAMESPACE::InputExc,
                            "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                            << ") is missing.");
                    }
                    else if (EXR_ERR_SUCCESS != rv)
                        throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                    ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                        new TileBufferTask (&tg, this, &tpg, &frameBuffer, cinfo, countsOnly) );
                }
            }
        }

        tpg.throw_on_failure ();
    }
    else
#endif
    {
        TileProcess tp;

        tp.counts_only = countsOnly;
        for (int ty = dy1; ty <= dy2; ++ty)
        {
            for (int tx = dx1; tx <= dx2; ++tx)
            {
                exr_result_t rv = exr_read_tile_chunk_info (
                    *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                        << ") is missing.");
                }
                else if (EXR_ERR_SUCCESS != rv)
                    throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                tp.cinfo = cinfo;
                tp.run_decode (
                    *_ctxt,
                    partNumber,
                    &frameBuffer,
                    fill_list);
            }
        }
    }
}